

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O0

USTATUS decompress(UByteArray *compressedData,UINT8 compressionType,UINT8 *algorithm,
                  UINT32 *dictionarySize,UByteArray *decompressedData,
                  UByteArray *efiDecompressedData)

{
  uint uVar1;
  UINTN UVar2;
  USTATUS UVar3;
  UByteArray local_170;
  UInt32 local_14c;
  undefined1 local_148 [4];
  UINT32 state;
  UByteArray local_128;
  UByteArray local_108;
  UByteArray local_e8;
  UByteArray local_b8;
  UINTN local_98;
  USTATUS EfiResult;
  USTATUS TianoResult;
  USTATUS result;
  EFI_TIANO_HEADER *header;
  void *pvStack_70;
  UINT32 scratchSize;
  UINT8 *scratch;
  char *pcStack_60;
  UINT32 decompressedSize;
  UINT8 *efiDecompressed;
  UINT8 *decompressed;
  uint *puStack_48;
  UINT32 dataSize;
  UINT8 *data;
  UByteArray *efiDecompressedData_local;
  UByteArray *decompressedData_local;
  UINT32 *dictionarySize_local;
  UINT8 *algorithm_local;
  UByteArray *pUStack_18;
  UINT8 compressionType_local;
  UByteArray *compressedData_local;
  
  scratch._4_4_ = 0;
  header._4_4_ = 0;
  *dictionarySize = 0;
  data = (UINT8 *)efiDecompressedData;
  efiDecompressedData_local = decompressedData;
  decompressedData_local = (UByteArray *)dictionarySize;
  dictionarySize_local = (UINT32 *)algorithm;
  algorithm_local._7_1_ = compressionType;
  pUStack_18 = compressedData;
  if (compressionType == '\0') {
    UByteArray::operator=(decompressedData,compressedData);
    *(undefined1 *)dictionarySize_local = 1;
    compressedData_local = (UByteArray *)0x0;
  }
  else if (compressionType == '\x01') {
    *algorithm = '\0';
    puStack_48 = (uint *)UByteArray::data(compressedData);
    decompressed._4_4_ = UByteArray::size(pUStack_18);
    result = (USTATUS)puStack_48;
    if ((ulong)*puStack_48 + 8 == (ulong)decompressed._4_4_) {
      UVar2 = EfiTianoGetInfo(puStack_48,decompressed._4_4_,(UINT32 *)((long)&scratch + 4),
                              (UINT32 *)((long)&header + 4));
      if (UVar2 == 0) {
        efiDecompressed = (UINT8 *)malloc((ulong)scratch._4_4_);
        pcStack_60 = (char *)malloc((ulong)scratch._4_4_);
        pvStack_70 = malloc((ulong)header._4_4_);
        if (((efiDecompressed == (UINT8 *)0x0) || (pcStack_60 == (char *)0x0)) ||
           (pvStack_70 == (void *)0x0)) {
          free(efiDecompressed);
          free(pcStack_60);
          free(pvStack_70);
          compressedData_local = (UByteArray *)0x18;
        }
        else {
          TianoResult = 0;
          EfiResult = TianoDecompress(puStack_48,decompressed._4_4_,efiDecompressed,scratch._4_4_,
                                      pvStack_70,header._4_4_);
          local_98 = EfiDecompress(puStack_48,decompressed._4_4_,pcStack_60,scratch._4_4_,pvStack_70
                                   ,header._4_4_);
          if (scratch._4_4_ < 0x80000000) {
            if ((local_98 == 0) && (EfiResult == 0)) {
              *(undefined1 *)dictionarySize_local = 4;
              UByteArray::UByteArray(&local_b8,(char *)efiDecompressed,scratch._4_4_);
              UByteArray::operator=(efiDecompressedData_local,&local_b8);
              UByteArray::~UByteArray(&local_b8);
              UByteArray::UByteArray(&local_e8,pcStack_60,scratch._4_4_);
              UByteArray::operator=((UByteArray *)data,&local_e8);
              UByteArray::~UByteArray(&local_e8);
            }
            else if (EfiResult == 0) {
              *(undefined1 *)dictionarySize_local = 3;
              UByteArray::UByteArray(&local_108,(char *)efiDecompressed,scratch._4_4_);
              UByteArray::operator=(efiDecompressedData_local,&local_108);
              UByteArray::~UByteArray(&local_108);
            }
            else if (local_98 == 0) {
              *(undefined1 *)dictionarySize_local = 2;
              UByteArray::UByteArray(&local_128,pcStack_60,scratch._4_4_);
              UByteArray::operator=(efiDecompressedData_local,&local_128);
              UByteArray::~UByteArray(&local_128);
            }
            else {
              TianoResult = 0x18;
            }
          }
          else {
            TianoResult = 0x18;
          }
          free(efiDecompressed);
          free(pcStack_60);
          free(pvStack_70);
          compressedData_local = (UByteArray *)TianoResult;
        }
      }
      else {
        compressedData_local = (UByteArray *)0x18;
      }
    }
    else {
      compressedData_local = (UByteArray *)0x18;
    }
  }
  else if (compressionType == '\x02') {
    *algorithm = '\0';
    puStack_48 = (uint *)UByteArray::constData(compressedData);
    decompressed._4_4_ = UByteArray::size(pUStack_18);
    UVar3 = LzmaGetInfo(puStack_48,decompressed._4_4_,(UINT32 *)((long)&scratch + 4));
    if (UVar3 == 0) {
      *(undefined1 *)dictionarySize_local = 5;
    }
    else {
      puStack_48 = (uint *)((long)puStack_48 + 4);
      UVar3 = LzmaGetInfo(puStack_48,decompressed._4_4_,(UINT32 *)((long)&scratch + 4));
      if (UVar3 != 0) {
        return 0x19;
      }
      *(undefined1 *)dictionarySize_local = 6;
    }
    efiDecompressed = (UINT8 *)malloc((ulong)scratch._4_4_);
    if (efiDecompressed == (UINT8 *)0x0) {
      compressedData_local = (UByteArray *)0x4;
    }
    else {
      UVar3 = LzmaDecompress(puStack_48,decompressed._4_4_,efiDecompressed);
      if (UVar3 == 0) {
        if (scratch._4_4_ < 0x80000000) {
          uVar1 = readUnaligned<unsigned_int>((uint *)((long)puStack_48 + 1));
          *(uint *)&decompressedData_local->d = uVar1;
          UByteArray::UByteArray((UByteArray *)local_148,(char *)efiDecompressed,scratch._4_4_);
          UByteArray::operator=(efiDecompressedData_local,(UByteArray *)local_148);
          UByteArray::~UByteArray((UByteArray *)local_148);
          free(efiDecompressed);
          compressedData_local = (UByteArray *)0x0;
        }
        else {
          free(efiDecompressed);
          compressedData_local = (UByteArray *)0x19;
        }
      }
      else {
        free(efiDecompressed);
        compressedData_local = (UByteArray *)0x19;
      }
    }
  }
  else if (compressionType == 0x86) {
    *algorithm = '\0';
    puStack_48 = (uint *)UByteArray::constData(compressedData);
    decompressed._4_4_ = UByteArray::size(pUStack_18);
    UVar3 = LzmaGetInfo(puStack_48,decompressed._4_4_,(UINT32 *)((long)&scratch + 4));
    if (UVar3 == 0) {
      *(undefined1 *)dictionarySize_local = 7;
      efiDecompressed = (UINT8 *)malloc((ulong)scratch._4_4_);
      if (efiDecompressed == (UINT8 *)0x0) {
        compressedData_local = (UByteArray *)0x4;
      }
      else {
        UVar3 = LzmaDecompress(puStack_48,decompressed._4_4_,efiDecompressed);
        if (UVar3 == 0) {
          if (scratch._4_4_ < 0x80000000) {
            local_14c = 0;
            z7_BranchConvSt_X86_Dec(efiDecompressed,(ulong)scratch._4_4_,0,&local_14c);
            uVar1 = readUnaligned<unsigned_int>((uint *)((long)puStack_48 + 1));
            *(uint *)&decompressedData_local->d = uVar1;
            UByteArray::UByteArray(&local_170,(char *)efiDecompressed,scratch._4_4_);
            UByteArray::operator=(efiDecompressedData_local,&local_170);
            UByteArray::~UByteArray(&local_170);
            free(efiDecompressed);
            compressedData_local = (UByteArray *)0x0;
          }
          else {
            free(efiDecompressed);
            compressedData_local = (UByteArray *)0x19;
          }
        }
        else {
          free(efiDecompressed);
          compressedData_local = (UByteArray *)0x19;
        }
      }
    }
    else {
      compressedData_local = (UByteArray *)0x19;
    }
  }
  else {
    *algorithm = '\0';
    compressedData_local = (UByteArray *)0x1b;
  }
  return (USTATUS)compressedData_local;
}

Assistant:

USTATUS decompress(const UByteArray & compressedData, const UINT8 compressionType, UINT8 & algorithm, UINT32 & dictionarySize, UByteArray & decompressedData, UByteArray & efiDecompressedData)
{
    const UINT8* data;
    UINT32 dataSize;
    UINT8* decompressed;
    UINT8* efiDecompressed;
    UINT32 decompressedSize = 0;
    UINT8* scratch;
    UINT32 scratchSize = 0;
    const EFI_TIANO_HEADER* header;
    
    // For all but LZMA dictionary size is 0
    dictionarySize = 0;
    
    switch (compressionType)
    {
        case EFI_NOT_COMPRESSED: {
            decompressedData = compressedData;
            algorithm = COMPRESSION_ALGORITHM_NONE;
            return U_SUCCESS;
        }
        case EFI_STANDARD_COMPRESSION: {
            // Set default algorithm to unknown
            algorithm = COMPRESSION_ALGORITHM_UNKNOWN;
            
            // Get buffer sizes
            data = (UINT8*)compressedData.data();
            dataSize = (UINT32)compressedData.size();
            
            // Check header to be valid
            header = (const EFI_TIANO_HEADER*)data;
            if (header->CompSize + sizeof(EFI_TIANO_HEADER) != dataSize)
                return U_STANDARD_DECOMPRESSION_FAILED;
            
            // Get info function is the same for both algorithms
            if (U_SUCCESS != EfiTianoGetInfo(data, dataSize, &decompressedSize, &scratchSize))
                return U_STANDARD_DECOMPRESSION_FAILED;
            
            // Allocate memory
            decompressed = (UINT8*)malloc(decompressedSize);
            efiDecompressed = (UINT8*)malloc(decompressedSize);
            scratch = (UINT8*)malloc(scratchSize);
            if (!decompressed || !efiDecompressed || !scratch) {
                free(decompressed);
                free(efiDecompressed);
                free(scratch);
                return U_STANDARD_DECOMPRESSION_FAILED;
            }
            
            // Decompress section data using both algorithms
            USTATUS result = U_SUCCESS;
            // Try Tiano
            USTATUS TianoResult = TianoDecompress(data, dataSize, decompressed, decompressedSize, scratch, scratchSize);
            // Try EFI 1.1
            USTATUS EfiResult = EfiDecompress(data, dataSize, efiDecompressed, decompressedSize, scratch, scratchSize);
            
            if (decompressedSize > INT32_MAX) {
                result = U_STANDARD_DECOMPRESSION_FAILED;
            }
            else if (EfiResult == U_SUCCESS && TianoResult == U_SUCCESS) { // Both decompressions are OK
                algorithm = COMPRESSION_ALGORITHM_UNDECIDED;
                decompressedData = UByteArray((const char*)decompressed, (int)decompressedSize);
                efiDecompressedData = UByteArray((const char*)efiDecompressed, (int)decompressedSize);
            }
            else if (TianoResult == U_SUCCESS) { // Only Tiano is OK
                algorithm = COMPRESSION_ALGORITHM_TIANO;
                decompressedData = UByteArray((const char*)decompressed, (int)decompressedSize);
            }
            else if (EfiResult == U_SUCCESS) { // Only EFI 1.1 is OK
                algorithm = COMPRESSION_ALGORITHM_EFI11;
                decompressedData = UByteArray((const char*)efiDecompressed, (int)decompressedSize);
            }
            else { // Both decompressions failed
                result = U_STANDARD_DECOMPRESSION_FAILED;
            }
            
            free(decompressed);
            free(efiDecompressed);
            free(scratch);
            return result;
        }
        case EFI_CUSTOMIZED_COMPRESSION: {
            // Set default algorithm to unknown
            algorithm = COMPRESSION_ALGORITHM_UNKNOWN;
            
            // Get buffer sizes
            data = (const UINT8*)compressedData.constData();
            dataSize = (UINT32)compressedData.size();
            
            // Get info as normal LZMA section
            if (U_SUCCESS != LzmaGetInfo(data, dataSize, &decompressedSize)) {
                // Get info as Intel legacy LZMA section
                data += sizeof(UINT32);
                if (U_SUCCESS != LzmaGetInfo(data, dataSize, &decompressedSize)) {
                    return U_CUSTOMIZED_DECOMPRESSION_FAILED;
                }
                else {
                    algorithm = COMPRESSION_ALGORITHM_LZMA_INTEL_LEGACY;
                }
            }
            else {
                algorithm = COMPRESSION_ALGORITHM_LZMA;
            }
            
            // Allocate memory
            decompressed = (UINT8*)malloc(decompressedSize);
            if (!decompressed) {
                return U_OUT_OF_MEMORY;
            }
            
            // Decompress section data
            if (U_SUCCESS != LzmaDecompress(data, dataSize, decompressed)) {
                free(decompressed);
                return U_CUSTOMIZED_DECOMPRESSION_FAILED;
            }
            
            if (decompressedSize > INT32_MAX) {
                free(decompressed);
                return U_CUSTOMIZED_DECOMPRESSION_FAILED;
            }
            
            dictionarySize = readUnaligned((UINT32*)(data + 1)); // LZMA dictionary size is stored in bytes 1-4 of LZMA properties header
            decompressedData = UByteArray((const char*)decompressed, (int)decompressedSize);
            free(decompressed);
            return U_SUCCESS;
        }
        case EFI_CUSTOMIZED_COMPRESSION_LZMAF86: {
            // Set default algorithm to unknown
            algorithm = COMPRESSION_ALGORITHM_UNKNOWN;
            
            // Get buffer sizes
            data = (const UINT8*)compressedData.constData();
            dataSize = (UINT32)compressedData.size();
            
            // Get info as normal LZMA section
            if (U_SUCCESS != LzmaGetInfo(data, dataSize, &decompressedSize)) {
                return U_CUSTOMIZED_DECOMPRESSION_FAILED;
            }
            algorithm = COMPRESSION_ALGORITHM_LZMAF86;
            
            // Allocate memory
            decompressed = (UINT8*)malloc(decompressedSize);
            if (!decompressed) {
                return U_OUT_OF_MEMORY;
            }
            
            // Decompress section data
            if (U_SUCCESS != LzmaDecompress(data, dataSize, decompressed)) {
                free(decompressed);
                return U_CUSTOMIZED_DECOMPRESSION_FAILED;
            }
            
            if (decompressedSize > INT32_MAX) {
                free(decompressed);
                return U_CUSTOMIZED_DECOMPRESSION_FAILED;
            }
            
            // TODO: need to correctly handle non-x86 architecture of the FW image
            // After LZMA decompression, the data need to be converted to the raw data.
            UINT32 state = 0;
            z7_BranchConvSt_X86_Dec(decompressed, decompressedSize, 0, &state);
            
            dictionarySize = readUnaligned((UINT32*)(data + 1)); // LZMA dictionary size is stored in bytes 1-4 of LZMA properties header
            decompressedData = UByteArray((const char*)decompressed, (int)decompressedSize);
            free(decompressed);
            return U_SUCCESS;
        }
        default: {
            algorithm = COMPRESSION_ALGORITHM_UNKNOWN;
            return U_UNKNOWN_COMPRESSION_TYPE;
        }
    }
}